

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_Choice.H
# Opt level: O1

void Fl_Input_Choice::menu_cb(Fl_Widget *param_1,void *data)

{
  uint *puVar1;
  undefined8 *puVar2;
  Fl_Input_ *this;
  byte bVar3;
  int iVar4;
  char *str;
  Fl_Widget_Tracker wp;
  Fl_Widget_Tracker local_20;
  
  Fl_Widget_Tracker::Fl_Widget_Tracker(&local_20,(Fl_Widget *)data);
  puVar2 = *(undefined8 **)(*(long *)((long)data + 0xa8) + 0x80);
  if ((puVar2 == (undefined8 *)0x0) || ((*(byte *)(puVar2 + 4) & 0x60) == 0)) {
    this = *(Fl_Input_ **)((long)data + 0xa0);
    iVar4 = strcmp(this->value_,(char *)*puVar2);
    if (iVar4 == 0) {
      *(byte *)((long)data + 0x60) = *(byte *)((long)data + 0x60) & 0x7f;
      bVar3 = *(byte *)((long)data + 0x6f) & 2;
    }
    else {
      if (puVar2 == (undefined8 *)0x0) {
        str = (char *)0x0;
      }
      else {
        str = (char *)*puVar2;
      }
      Fl_Input_::value(this,str);
      puVar1 = (uint *)(*(long *)((long)data + 0xa0) + 0x60);
      *puVar1 = *puVar1 | 0x80;
      *(byte *)((long)data + 0x60) = *(byte *)((long)data + 0x60) | 0x80;
      bVar3 = *(byte *)((long)data + 0x6f) & 5;
    }
    if (bVar3 != 0) {
      Fl_Widget::do_callback((Fl_Widget *)data,(Fl_Widget *)data,*(void **)((long)data + 0x18));
    }
    if ((local_20.wp_ != (Fl_Widget *)0x0) &&
       (*(code **)((long)data + 0x10) != Fl_Widget::default_callback)) {
      *(byte *)((long)data + 0x60) = *(byte *)((long)data + 0x60) & 0x7f;
      puVar1 = (uint *)(*(long *)((long)data + 0xa0) + 0x60);
      *puVar1 = *puVar1 & 0xffffff7f;
    }
  }
  Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_20);
  return;
}

Assistant:

static void menu_cb(Fl_Widget*, void *data) { 
    Fl_Input_Choice *o=(Fl_Input_Choice *)data;
    Fl_Widget_Tracker wp(o);
    const Fl_Menu_Item *item = o->menubutton()->mvalue();
    if (item && item->flags & (FL_SUBMENU|FL_SUBMENU_POINTER)) return;	// ignore submenus
    if (!strcmp(o->inp_->value(), o->menu_->text()))
    {
      o->Fl_Widget::clear_changed();
      if (o->when() & FL_WHEN_NOT_CHANGED)
	o->do_callback();
    }
    else
    {
      o->inp_->value(o->menu_->text());
      o->inp_->set_changed();
      o->Fl_Widget::set_changed();
      if (o->when() & (FL_WHEN_CHANGED|FL_WHEN_RELEASE))
	o->do_callback();
    }
    
    if (wp.deleted()) return;

    if (o->callback() != default_callback)
    {
      o->Fl_Widget::clear_changed();
      o->inp_->clear_changed();
    }
  }